

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_global_unescape(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  uint32_t c;
  JSValueUnion p;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  JSValue v;
  StringBuffer b_s;
  
  v = JS_ToString(ctx,*argv);
  p = v.u;
  if ((int)v.tag != 6) {
    string_buffer_init(ctx,&b_s,0);
    uVar4 = *(uint *)((long)p.ptr + 4) & 0x7fffffff;
    iVar6 = 0;
    while (iVar6 < (int)uVar4) {
      lVar2 = (long)iVar6;
      iVar3 = (int)*(undefined8 *)((long)p.ptr + 4);
      if (iVar3 < 0) {
        c = (uint32_t)*(ushort *)((long)p.ptr + lVar2 * 2 + 0x10);
      }
      else {
        c = (uint32_t)*(byte *)((long)p.ptr + lVar2 + 0x10);
      }
      iVar5 = iVar6;
      if (c == 0x25) {
        if (iVar6 <= (int)(uVar4 - 6)) {
          if (iVar3 < 0) {
            uVar1 = *(ushort *)((long)p.ptr + lVar2 * 2 + 0x12);
          }
          else {
            uVar1 = (ushort)*(byte *)((long)p.ptr + lVar2 + 0x11);
          }
          if ((uVar1 == 0x75) && (c = string_get_hex((JSString *)p.ptr,iVar6 + 2,4), -1 < (int)c)) {
            iVar5 = iVar6 + 5;
            goto LAB_001573e3;
          }
        }
        if ((int)(uVar4 - 3) < iVar6) {
          c = 0x25;
        }
        else {
          c = string_get_hex((JSString *)p.ptr,iVar6 + 1,2);
          iVar5 = iVar6 + 2;
          if ((int)c < 0) {
            c = 0x25;
            iVar5 = iVar6;
          }
        }
      }
LAB_001573e3:
      string_buffer_putc16(&b_s,c);
      iVar6 = iVar5 + 1;
    }
    JS_FreeValue(ctx,v);
    v = string_buffer_end(&b_s);
  }
  return v;
}

Assistant:

static JSValue js_global_unescape(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int i, len, c, n;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    string_buffer_init(ctx, b, 0);
    p = JS_VALUE_GET_STRING(str);
    for (i = 0, len = p->len; i < len; i++) {
        c = string_get(p, i);
        if (c == '%') {
            if (i + 6 <= len
            &&  string_get(p, i + 1) == 'u'
            &&  (n = string_get_hex(p, i + 2, 4)) >= 0) {
                c = n;
                i += 6 - 1;
            } else
            if (i + 3 <= len
            &&  (n = string_get_hex(p, i + 1, 2)) >= 0) {
                c = n;
                i += 3 - 1;
            }
        }
        string_buffer_putc16(b, c);
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);
}